

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O0

void __thiscall UEFITool::goToData(UEFITool *this)

{
  int iVar1;
  bool bVar2;
  UINT8 UVar3;
  int iVar4;
  UINT32 UVar5;
  long *plVar6;
  QAbstractItemModel *pQVar7;
  undefined1 local_a0 [8];
  QModelIndex currentIndex;
  QFlags<QItemSelectionModel::SelectionFlag> local_80;
  int j;
  UINT32 local_78;
  UINT32 offset;
  char *local_68;
  NVAR_ENTRY_PARSING_DATA *pdata;
  QByteArray rdata;
  undefined1 local_40 [4];
  int i;
  QModelIndex parent;
  QModelIndex index;
  UEFITool *this_local;
  
  QAbstractItemView::selectionModel();
  QItemSelectionModel::currentIndex();
  bVar2 = QModelIndex::isValid((QModelIndex *)&parent.m);
  if (((bVar2) && (UVar3 = TreeModel::type(this->model,(QModelIndex *)&parent.m), UVar3 == 'O')) &&
     (UVar3 = TreeModel::subtype(this->model,(QModelIndex *)&parent.m), UVar3 == 0x84)) {
    (**(code **)(*(long *)this->model + 0x68))(local_40,this->model,&parent.m);
    for (rdata.d.size._4_4_ = QModelIndex::row((QModelIndex *)&parent.m); iVar1 = rdata.d.size._4_4_
        , iVar4 = (**(code **)(*(long *)this->model + 0x78))(this->model,local_40), iVar1 < iVar4;
        rdata.d.size._4_4_ = rdata.d.size._4_4_ + 1) {
      bVar2 = TreeModel::hasEmptyParsingData(this->model,(QModelIndex *)&parent.m);
      if (!bVar2) {
        TreeModel::parsingData((QByteArray *)&pdata,this->model,(QModelIndex *)&parent.m);
        local_68 = QByteArray::constData((QByteArray *)&pdata);
        local_78 = TreeModel::offset(this->model,(QModelIndex *)&parent.m);
        iVar1 = rdata.d.size._4_4_;
        if (*(int *)(local_68 + 4) == 0xffffff) {
          (**(code **)(**(long **)(this->ui + 0x130) + 0x1e8))
                    (*(long **)(this->ui + 0x130),&parent.m,3);
          plVar6 = (long *)QAbstractItemView::selectionModel();
          local_80 = operator|(Select,Rows);
          j = (int)QFlags<QItemSelectionModel::SelectionFlag>::operator|(&local_80,Clear);
          (**(code **)(*plVar6 + 0x68))(plVar6,&parent.m,j);
          iVar1 = rdata.d.size._4_4_;
        }
        do {
          currentIndex.m._4_4_ = iVar1 + 1;
          iVar1 = currentIndex.m._4_4_;
          iVar4 = (**(code **)(*(long *)this->model + 0x78))(this->model,local_40);
          if (iVar4 <= iVar1) goto LAB_0012c456;
          pQVar7 = QModelIndex::model((QModelIndex *)local_40);
          (**(code **)(*(long *)pQVar7 + 0x60))
                    (local_a0,pQVar7,currentIndex.m._4_4_,0,(QModelIndex *)local_40);
          bVar2 = TreeModel::hasEmptyParsingData(this->model,(QModelIndex *)local_a0);
          iVar1 = currentIndex.m._4_4_;
        } while ((bVar2) ||
                (UVar5 = TreeModel::offset(this->model,(QModelIndex *)local_a0),
                iVar1 = currentIndex.m._4_4_, UVar5 != local_78 + *(int *)(local_68 + 4)));
        parent.m = (QAbstractItemModel *)local_a0;
LAB_0012c456:
        QByteArray::~QByteArray((QByteArray *)&pdata);
      }
    }
  }
  return;
}

Assistant:

void UEFITool::goToData()
{
    QModelIndex index = ui->structureTreeView->selectionModel()->currentIndex();
    if (!index.isValid() || model->type(index) != Types::NvarEntry || model->subtype(index) != Subtypes::LinkNvarEntry)
        return;
    
    // Get parent
    QModelIndex parent = model->parent(index);
    
    for (int i = index.row(); i < model->rowCount(parent); i++) {
        if (model->hasEmptyParsingData(index))
            continue;
        
        UByteArray rdata = model->parsingData(index);
        const NVAR_ENTRY_PARSING_DATA* pdata = (const NVAR_ENTRY_PARSING_DATA*)rdata.constData();
        UINT32 offset = model->offset(index);
        if (pdata->next == 0xFFFFFF) {
            ui->structureTreeView->scrollTo(index, QAbstractItemView::PositionAtCenter);
            ui->structureTreeView->selectionModel()->select(index, QItemSelectionModel::Select | QItemSelectionModel::Rows | QItemSelectionModel::Clear);
        }
        
        for (int j = i + 1; j < model->rowCount(parent); j++) {
            QModelIndex currentIndex = parent.model()->index(j, 0, parent);
            
            if (model->hasEmptyParsingData(currentIndex))
                continue;
            
            if (model->offset(currentIndex) == offset + pdata->next) {
                index = currentIndex;
                break;
            }
        }
    }
}